

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O1

matrix4 * v3rotationMat(vector3d *axis,double theta,matrix4 *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = axis->x;
  dVar2 = axis->y;
  dVar3 = axis->z;
  dVar5 = cos(theta * 0.017453293);
  dVar6 = sin(theta * 0.017453293);
  dVar7 = 1.0 - dVar5;
  m->element[0][1] = 0.0;
  m->element[0][2] = 0.0;
  m->element[0][3] = 0.0;
  m->element[1][0] = 0.0;
  m->element[1][2] = 0.0;
  m->element[1][3] = 0.0;
  m->element[2][0] = 0.0;
  m->element[2][1] = 0.0;
  m->element[2][3] = 0.0;
  m->element[3][0] = 0.0;
  m->element[3][1] = 0.0;
  m->element[3][2] = 0.0;
  m->element[3][3] = 1.0;
  dVar4 = dVar1 * dVar7;
  m->element[0][0] = dVar4 * dVar1 + dVar5;
  m->element[0][1] = dVar4 * dVar2 + dVar3 * dVar6;
  m->element[0][2] = dVar4 * dVar3 - dVar2 * dVar6;
  dVar4 = dVar2 * dVar7;
  m->element[1][0] = dVar4 * dVar1 - dVar3 * dVar6;
  m->element[1][1] = dVar4 * dVar2 + dVar5;
  m->element[1][2] = dVar4 * dVar3 + dVar6 * dVar1;
  dVar7 = dVar7 * dVar3;
  m->element[2][0] = dVar1 * dVar7 + dVar2 * dVar6;
  m->element[2][1] = dVar2 * dVar7 - dVar6 * dVar1;
  m->element[2][2] = dVar7 * dVar3 + dVar5;
  return m;
}

Assistant:

matrix4*  v3rotationMat(vector3d* axis, double theta, matrix4* m) {
	double c, s, t, x, y, z;

	x = axis->x;
	y = axis->y;
	z = axis->z;

	c = cos(theta*DEG2RAD);
	s = sin(theta*DEG2RAD);
	t = 1.0 - c;

	v3identityMat(m);

	m->element[0][0] = t * x * x    +        c;
	m->element[0][1] = t * x * y    +    z * s;
	m->element[0][2] = t * x * z    -    y * s;

	m->element[1][0] = t * y * x    -    z * s;
	m->element[1][1] = t * y * y    +        c;
	m->element[1][2] = t * y * z    +    x * s;

	m->element[2][0] = t * z * x    +    y * s;
	m->element[2][1] = t * z * y    -    x * s;
	m->element[2][2] = t * z * z    +        c;

	return(m);
}